

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllStructFields
          (RustGenerator *this,StructDef *struct_def,
          function<void_(const_flatbuffers::FieldDef_&)> *cb)

{
  CodeWriter *this_00;
  Value *type;
  int *piVar1;
  BaseType BVar2;
  int iVar3;
  FieldDef *field;
  size_t sVar4;
  char *__s;
  allocator<char> local_9a;
  allocator<char> local_99;
  unsigned_long local_98;
  function<void_(const_flatbuffers::FieldDef_&)> *local_90;
  IdlNamer *local_88;
  StructDef *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_78 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->code_;
  local_88 = &this->namer_;
  local_98 = 0;
  local_90 = cb;
  local_80 = struct_def;
  for (; local_78 !=
         (local_80->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_finish; local_78 = local_78 + 1) {
    field = *local_78;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD_TYPE",&local_9a);
    type = &field->value;
    GetTypeGet_abi_cxx11_(&local_70,this,&type->type);
    CodeWriter::SetValue(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD_OTY",&local_9a);
    ObjectFieldType_abi_cxx11_(&local_70,this,field,false);
    CodeWriter::SetValue(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD",&local_9a);
    (*(local_88->super_Namer)._vptr_Namer[0x12])(&local_70,local_88,field);
    CodeWriter::SetValue(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FIELD_OFFSET",&local_9a)
    ;
    NumToString<unsigned_long>(&local_70,local_98);
    CodeWriter::SetValue(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"REF",&local_9a);
    BVar2 = (type->type).base_type;
    if (((BVar2 != BASE_TYPE_STRUCT) ||
        (__s = "&", ((field->value).type.struct_def)->fixed == false)) &&
       (__s = "", BVar2 == BASE_TYPE_ARRAY)) {
      __s = "&";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_99);
    CodeWriter::SetValue(this_00,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::function<void_(const_flatbuffers::FieldDef_&)>::operator()(local_90,field);
    iVar3 = (this->code_).cur_ident_lvl_;
    if (iVar3 != 0) {
      (this->code_).cur_ident_lvl_ = iVar3 + -1;
    }
    sVar4 = InlineSize(&type->type);
    local_98 = sVar4 + local_98 + field->padding;
  }
  return;
}

Assistant:

void ForAllStructFields(const StructDef &struct_def,
                          std::function<void(const FieldDef &field)> cb) {
    size_t offset_to_field = 0;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      code_.SetValue("FIELD_TYPE", GetTypeGet(field.value.type));
      code_.SetValue("FIELD_OTY", ObjectFieldType(field, false));
      code_.SetValue("FIELD", namer_.Field(field));
      code_.SetValue("FIELD_OFFSET", NumToString(offset_to_field));
      code_.SetValue(
          "REF",
          IsStruct(field.value.type) || IsArray(field.value.type) ? "&" : "");
      code_.IncrementIdentLevel();
      cb(field);
      code_.DecrementIdentLevel();
      const size_t size = InlineSize(field.value.type);
      offset_to_field += size + field.padding;
    }
  }